

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O3

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CCallMethodExp *expression)

{
  IExpression *pIVar1;
  pointer pcVar2;
  CExpList *pCVar3;
  __uniq_ptr_data<IExpression,_std::default_delete<IExpression>,_true,_true> _Var4;
  ISubtreeWrapper *pIVar5;
  long lVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Alloc_hider _Var9;
  CCallMethodExp *this_02;
  int iVar10;
  _Head_base<0UL,_IRT::ISubtreeWrapper_*,_false> this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  CCallExpression *this_04;
  CNameExpression *this_05;
  const_iterator cVar12;
  mapped_type *pmVar13;
  undefined8 uVar14;
  pointer *__ptr;
  CBuildVisitor *this_06;
  pointer puVar15;
  string mineMethodObjectClassName;
  undefined1 local_b8 [24];
  _Head_base<0UL,_IRT::ISubtreeWrapper_*,_false> local_a0;
  string local_98;
  CLabel local_78;
  CCallMethodExp *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char local_40 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CCallMethod\n",0x19);
  pIVar1 = (expression->objectExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&local_98);
  _Var9._M_p = local_98._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar2 = (this->currentObjectClassName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (this->currentObjectClassName)._M_string_length);
  iVar10 = std::__cxx11::string::compare((char *)&local_98);
  if (iVar10 == 0) {
    __assert_fail("mineMethodObjectClassName != \"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                  ,0x98,"virtual void CBuildVisitor::Visit(CCallMethodExp &)");
  }
  this_03._M_head_impl = (ISubtreeWrapper *)operator_new(0x20);
  IRT::CExpressionList::CExpressionList((CExpressionList *)this_03._M_head_impl,(CExpression *)0x0);
  pCVar3 = (expression->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>.
           _M_t.super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
           super__Head_base<0UL,_CExpList_*,_false>._M_head_impl;
  this_06 = (CBuildVisitor *)(local_b8 + 0x10);
  local_b8._16_8_ = _Var9._M_p;
  IRT::CExpressionList::Add
            ((CExpressionList *)this_03._M_head_impl,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             this_06);
  local_58 = expression;
  if ((SymbolTable *)local_b8._16_8_ != (SymbolTable *)0x0) {
    (*(code *)(((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
                 *)local_b8._16_8_)->_M_h)._M_buckets[2])();
  }
  local_b8._16_8_ = (SymbolTable *)0x0;
  puVar15 = *(pointer *)
             &(pCVar3->exps).
              super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
              ._M_impl;
  if (puVar15 !=
      (pCVar3->exps).
      super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      _Var4.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
      super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
      super__Head_base<0UL,_IExpression_*,_false>._M_head_impl =
           (puVar15->_M_t).super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>;
      (*(code *)**(undefined8 **)
                  _Var4.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                  super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl)
                (_Var4.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                 super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                 super__Head_base<0UL,_IExpression_*,_false>._M_head_impl,this);
      (**((this->wrapper)._M_t.
          super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
          _M_t.
          super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
          .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper
      )(&local_78);
      local_b8._0_8_ = local_78.label._M_dataplus._M_p;
      local_78.label._M_dataplus._M_p = (pointer)0x0;
      this_06 = (CBuildVisitor *)local_b8;
      IRT::CExpressionList::Add
                ((CExpressionList *)this_03._M_head_impl,
                 (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *
                 )local_b8);
      if ((_Head_base<0UL,_const_IRT::CExpression_*,_false>)local_b8._0_8_ !=
          (_Head_base<0UL,_const_IRT::CExpression_*,_false>)0x0) {
        (*(((IExpression *)local_b8._0_8_)->super_INode)._vptr_INode[2])();
      }
      local_b8._0_8_ =
           (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           )0x0;
      if ((CExpression *)local_78.label._M_dataplus._M_p != (CExpression *)0x0) {
        (**(code **)((long)*(IExpression *)local_78.label._M_dataplus._M_p + 0x10))();
      }
      puVar15 = puVar15 + 1;
    } while (puVar15 !=
             (pCVar3->exps).
             super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x10);
  this_04 = (CCallExpression *)operator_new(0x18);
  this_02 = local_58;
  this_05 = (CNameExpression *)operator_new(0x28);
  GetMethodFullName((string *)&local_50,this_06,&local_98,
                    &((this_02->methodName)._M_t.
                      super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                      super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                      super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->name);
  IRT::CLabel::CLabel(&local_78,(string *)&local_50);
  IRT::CNameExpression::CNameExpression(this_05,&local_78);
  local_b8._8_8_ = this_03._M_head_impl;
  local_a0._M_head_impl = (ISubtreeWrapper *)this_05;
  IRT::CCallExpression::CCallExpression
            (this_04,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                      *)&local_a0,
             (unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
              *)(local_b8 + 8));
  p_Var11->_vptr__Sp_counted_base = (_func_int **)&PTR_ToExpression_00181498;
  *(CCallExpression **)&p_Var11->_M_use_count = this_04;
  pIVar5 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)p_Var11;
  if (pIVar5 != (ISubtreeWrapper *)0x0) {
    operator_delete(pIVar5);
  }
  if ((_Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>)local_b8._8_8_ !=
      (_Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>)0x0) {
    (*(((IExpression *)local_b8._8_8_)->super_INode)._vptr_INode[2])();
  }
  local_b8._8_8_ = (ISubtreeWrapper *)0x0;
  if ((CNameExpression *)local_a0._M_head_impl != (CNameExpression *)0x0) {
    (*(((CExpression *)&(local_a0._M_head_impl)->_vptr_ISubtreeWrapper)->super_IExpression).
      super_INode._vptr_INode[2])();
  }
  local_a0._M_head_impl = (ISubtreeWrapper *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.label._M_dataplus._M_p != &local_78.label.field_2) {
    operator_delete(local_78.label._M_dataplus._M_p);
  }
  if ((char *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  cVar12 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)this->symbolTable,&local_98);
  if (cVar12.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar14 = std::__throw_out_of_range("_Map_base::at");
    if ((_Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>)this_03._M_head_impl !=
        (_Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03._M_head_impl);
    }
    if (this_02 != (CCallMethodExp *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
    }
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    _Unwind_Resume(uVar14);
  }
  lVar6 = *(long *)((long)cVar12.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
                          ._M_cur + 0x28);
  p_Var11 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)cVar12.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
                    ._M_cur + 0x30);
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
    }
  }
  pmVar13 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(lVar6 + 0x30),
                         &((this_02->methodName)._M_t.
                           super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->name);
  peVar7 = (pmVar13->super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (pmVar13->super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  peVar8 = (peVar7->returnType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (peVar7->returnType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  if (peVar8->isPrimitive == true) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->currentObjectClassName,0,
               (char *)(this->currentObjectClassName)._M_string_length,0x15a41a);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->currentObjectClassName);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CCallMethodExp &expression ) {

    std::cout << "IRT builder: CCallMethod\n";

    expression.objectExpression->Accept( *this );
    std::unique_ptr<const IRT::CExpression> objectExpression = std::move( wrapper->ToExpression( ));
    std::string mineMethodObjectClassName = currentObjectClassName;
    assert( mineMethodObjectClassName != "" );

    IRT::CExpressionList *expressionListIrt = new IRT::CExpressionList( );
    std::vector<std::unique_ptr<IExpression> > &arguments = expression.args->exps;
    expressionListIrt->Add( std::move( objectExpression ));
    for ( auto it = arguments.begin( ); it != arguments.end( ); ++it ) {
        ( *it )->Accept( *this );
        expressionListIrt->Add( std::move( wrapper->ToExpression( )));
    }

    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            new IRT::CCallExpression(
                    std::unique_ptr<const IRT::CNameExpression>( new IRT::CNameExpression(
                            IRT::CLabel( GetMethodFullName( mineMethodObjectClassName, expression.methodName->name ))
                    )),
                    std::unique_ptr<const IRT::CExpressionList>( expressionListIrt ))
    ));

    std::shared_ptr<ClassInfo> classInfo = symbolTable->classes.at( mineMethodObjectClassName );
    auto methodInfo = classInfo->methods[ expression.methodName->name ];
    auto returnTypeInfo = methodInfo->returnType;
    if ( returnTypeInfo->isPrimitive ) {
        currentObjectClassName = "";
    } else {
        currentObjectClassName = returnTypeInfo->className;
    }
}